

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiDisplayTimingTests.cpp
# Opt level: O0

void __thiscall
vkt::wsi::anon_unknown_0::DisplayTimingTestInstance::render(DisplayTimingTestInstance *this)

{
  deUint32 imageHeight;
  VkDevice pVVar1;
  VkCommandPool VVar2;
  VkPipelineLayout pipelineLayout;
  VkRenderPass renderPass;
  VkFramebuffer framebuffer;
  VkQueue queue;
  VkResult VVar3;
  size_type sVar4;
  reference pvVar5;
  TestContext *this_00;
  TestLog *this_01;
  VkDevice_s **ppVVar6;
  Handle<(vk::HandleType)24> *pHVar7;
  reference ppVVar8;
  Handle<(vk::HandleType)26> *pHVar9;
  Handle<(vk::HandleType)16> *pHVar10;
  Handle<(vk::HandleType)17> *pHVar11;
  reference pvVar12;
  Handle<(vk::HandleType)18> *pHVar13;
  VkCommandBuffer_s *pVVar14;
  const_reference pvVar15;
  mapped_type_conflict1 *pmVar16;
  MessageBuilder *pMVar17;
  ulong uVar18;
  deUint64 dVar19;
  mapped_type_conflict1 mVar20;
  reference pvVar21;
  deUint32 dVar22;
  undefined1 local_1b00 [8];
  VkPresentInfoKHR presentInfo_1;
  undefined1 local_1ab8 [4];
  VkResult result_1;
  VkPresentInfoKHR presentInfo;
  VkPresentTimesInfoGOOGLE presentTimesInfo;
  deUint64 desiredPresentTime;
  deUint64 curtimeNano;
  VkPresentTimeGOOGLE presentTime;
  Handle<(vk::HandleType)6> HStack_1a30;
  VkResult result;
  undefined1 local_1a28 [8];
  VkSubmitInfo submitInfo;
  undefined1 local_19d8 [4];
  VkPipelineStageFlags dstStageMask;
  MessageBuilder local_1858;
  MessageBuilder local_16d8;
  MessageBuilder local_1558;
  MessageBuilder local_13d8;
  MessageBuilder local_1258;
  MessageBuilder local_10d8;
  unsigned_long local_f58;
  deUint64 diff;
  deUint64 earliest;
  deUint64 actual_1;
  MessageBuilder local_dc0;
  MessageBuilder local_c40;
  MessageBuilder local_ac0;
  MessageBuilder local_940;
  MessageBuilder local_7c0;
  MessageBuilder local_640;
  allocator<char> local_4b9;
  string local_4b8;
  MessageBuilder local_498;
  MessageBuilder local_318;
  unsigned_long local_198;
  deUint64 diff2;
  deUint64 diff1;
  deUint64 rdur;
  deUint64 desired;
  deUint64 actual;
  deInt64 multiple;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  ulong local_108;
  size_t pastPresentationInfoNdx;
  bool isLate;
  VkSwapchainKHR VStack_f8;
  bool isEarly;
  undefined1 local_f0 [8];
  vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
  pastPresentationTimings;
  Move<vk::VkCommandBuffer_s_*> local_a0;
  deUint64 local_80;
  deUint64 local_78;
  deUint64 local_70;
  undefined1 local_64 [8];
  deUint32 imageIndex;
  VkSemaphore currentRenderSemaphore;
  VkSemaphore currentAcquireSemaphore;
  TestLog *log;
  deUint32 height;
  deUint32 width;
  VkFence fence;
  deUint64 foreverNs;
  DisplayTimingTestInstance *this_local;
  
  fence.m_internal = 0xffffffffffffffff;
  uVar18 = this->m_frameNdx;
  sVar4 = std::
          vector<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>::
          size(&this->m_fences);
  pvVar5 = std::
           vector<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>::
           operator[](&this->m_fences,uVar18 % sVar4);
  _height = pvVar5->m_internal;
  dVar22 = (this->m_swapchainConfig).imageExtent.width;
  imageHeight = (this->m_swapchainConfig).imageExtent.height;
  this_00 = Context::getTestContext((this->super_TestInstance).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  uVar18 = this->m_frameNdx;
  sVar4 = std::
          vector<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>::
          size(&this->m_fences);
  if (sVar4 <= uVar18) {
    ppVVar6 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                        (&(this->m_device).super_RefBase<vk::VkDevice_s_*>);
    VVar3 = ::vk::DeviceDriver::waitForFences
                      (&this->m_vkd,*ppVVar6,1,(VkFence *)&height,1,0xffffffffffffffff);
    ::vk::checkResult(VVar3,"m_vkd.waitForFences(*m_device, 1u, &fence, VK_TRUE, foreverNs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x43d);
    ppVVar6 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                        (&(this->m_device).super_RefBase<vk::VkDevice_s_*>);
    VVar3 = ::vk::DeviceDriver::resetFences(&this->m_vkd,*ppVVar6,1,(VkFence *)&height);
    ::vk::checkResult(VVar3,"m_vkd.resetFences(*m_device, 1u, &fence)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x43e);
    ppVVar6 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                        (&(this->m_device).super_RefBase<vk::VkDevice_s_*>);
    pVVar1 = *ppVVar6;
    pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                       (&(this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
    VVar2.m_internal = pHVar7->m_internal;
    uVar18 = this->m_frameNdx;
    sVar4 = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::size
                      (&this->m_commandBuffers);
    ppVVar8 = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::
              operator[](&this->m_commandBuffers,uVar18 % sVar4);
    ::vk::DeviceDriver::freeCommandBuffers(&this->m_vkd,pVVar1,VVar2,1,ppVVar8);
    uVar18 = this->m_frameNdx;
    sVar4 = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::size
                      (&this->m_commandBuffers);
    ppVVar8 = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::
              operator[](&this->m_commandBuffers,uVar18 % sVar4);
    *ppVVar8 = (value_type)0x0;
  }
  currentRenderSemaphore.m_internal = (this->m_freeAcquireSemaphore).m_internal;
  unique0x00012000 = (this->m_freeRenderSemaphore).m_internal;
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                      (&(this->m_device).super_RefBase<vk::VkDevice_s_*>);
  pVVar1 = *ppVVar6;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)26>_>::operator*
                     (&(this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>);
  local_70 = pHVar9->m_internal;
  local_78 = currentRenderSemaphore.m_internal;
  local_80 = _height;
  VVar3 = ::vk::DeviceDriver::acquireNextImageKHR
                    (&this->m_vkd,pVVar1,(VkSwapchainKHR)local_70,0xffffffffffffffff,
                     currentRenderSemaphore,_height,(deUint32 *)local_64);
  ::vk::checkResult(VVar3,
                    "m_vkd.acquireNextImageKHR(*m_device, *m_swapchain, foreverNs, currentAcquireSemaphore, fence, &imageIndex)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                    ,0x449);
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                      (&(this->m_device).super_RefBase<vk::VkDevice_s_*>);
  pVVar1 = *ppVVar6;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     (&(this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  VVar2.m_internal = pHVar7->m_internal;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  pipelineLayout.m_internal = pHVar10->m_internal;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  renderPass.m_internal = pHVar11->m_internal;
  pvVar12 = std::
            vector<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
            ::operator[](&this->m_framebuffers,(ulong)(uint)local_64._0_4_);
  framebuffer.m_internal = pvVar12->m_internal;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  createCommandBuffer(&local_a0,&(this->m_vkd).super_DeviceInterface,pVVar1,VVar2,pipelineLayout,
                      renderPass,framebuffer,(VkPipeline)pHVar13->m_internal,this->m_frameNdx,
                      this->m_quadCount,dVar22,imageHeight);
  pVVar14 = ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::disown(&local_a0);
  uVar18 = this->m_frameNdx;
  sVar4 = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::size
                    (&this->m_commandBuffers);
  ppVVar8 = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::
            operator[](&this->m_commandBuffers,uVar18 % sVar4);
  *ppVVar8 = pVVar14;
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_a0);
  if ((this->m_useDisplayTiming & 1U) != 0) {
    ppVVar6 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                        (&(this->m_device).super_RefBase<vk::VkDevice_s_*>);
    pVVar1 = *ppVVar6;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)26>_>::operator*
                       (&(this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>);
    VStack_f8.m_internal = pHVar9->m_internal;
    getPastPresentationTiming
              ((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                *)local_f0,&(this->m_vkd).super_DeviceInterface,pVVar1,VStack_f8);
    pastPresentationInfoNdx._7_1_ = 0;
    pastPresentationInfoNdx._6_1_ = 0;
    for (local_108 = 0; uVar18 = local_108,
        sVar4 = std::
                vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                ::size((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                        *)local_f0), uVar18 < sVar4; local_108 = local_108 + 1) {
      pvVar15 = std::
                vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                ::operator[]((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                              *)local_f0,local_108);
      pmVar16 = std::
                map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                ::operator[](&this->m_queuePresentTimes,&pvVar15->presentID);
      uVar18 = *pmVar16;
      pvVar15 = std::
                vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                ::operator[]((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                              *)local_f0,local_108);
      if (pvVar15->actualPresentTime < uVar18) {
        pvVar15 = std::
                  vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                  ::operator[]((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                                *)local_f0,local_108);
        de::toString<unsigned_int>((string *)&multiple,&pvVar15->presentID);
        std::operator+(&local_148,"Image with PresentID ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &multiple);
        std::operator+(&local_128,&local_148,"was displayed before vkQueuePresentKHR was called.");
        tcu::ResultCollector::fail(&this->m_resultCollector,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&multiple);
      }
      if (this->m_ignoreThruPresentID == 0) {
        dVar22 = this->m_nextPresentID;
        pvVar15 = std::
                  vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                  ::back((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                          *)local_f0);
        actual = (deUint64)(dVar22 - pvVar15->presentID);
        pvVar15 = std::
                  vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                  ::back((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                          *)local_f0);
        this->m_prevDesiredPresentTime = pvVar15->actualPresentTime + actual * this->m_targetIPD;
        pvVar15 = std::
                  vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                  ::operator[]((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                                *)local_f0,local_108);
        this->m_ignoreThruPresentID = pvVar15->presentID + 1;
      }
      else {
        pvVar15 = std::
                  vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                  ::operator[]((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                                *)local_f0,local_108);
        if (this->m_ignoreThruPresentID < pvVar15->presentID) {
          pvVar15 = std::
                    vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                    ::operator[]((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                                  *)local_f0,local_108);
          uVar18 = pvVar15->actualPresentTime;
          pvVar15 = std::
                    vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                    ::operator[]((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                                  *)local_f0,local_108);
          if (pvVar15->desiredPresentTime + (this->m_rcDuration).refreshDuration + 1000000 < uVar18)
          {
            pvVar15 = std::
                      vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                      ::operator[]((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                                    *)local_f0,local_108);
            desired = pvVar15->actualPresentTime;
            pvVar15 = std::
                      vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                      ::operator[]((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                                    *)local_f0,local_108);
            rdur = pvVar15->desiredPresentTime;
            diff1 = (this->m_rcDuration).refreshDuration;
            diff2 = desired - (rdur + diff1);
            local_198 = desired - rdur;
            tcu::TestLog::operator<<(&local_318,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar17 = tcu::MessageBuilder::operator<<(&local_318,(char (*) [17])"Image PresentID ");
            pvVar15 = std::
                      vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                      ::operator[]((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                                    *)local_f0,local_108);
            pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&pvVar15->presentID);
            pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [6])0x137c5b9);
            pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&diff2);
            pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [12])" nsec late.");
            tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_318);
            if (((this->m_ExpectImage80Late & 1U) != 0) &&
               (pvVar15 = std::
                          vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                          ::operator[]((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                                        *)local_f0,local_108), pvVar15->presentID == 0x50)) {
              if (diff2 < 0x1dcd6501) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4b8,
                           "Image PresentID 80 was not late by approximately 1 second, as expected."
                           ,&local_4b9);
                tcu::ResultCollector::fail(&this->m_resultCollector,&local_4b8);
                std::__cxx11::string::~string((string *)&local_4b8);
                std::allocator<char>::~allocator(&local_4b9);
              }
              else {
                tcu::TestLog::operator<<
                          (&local_498,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar17 = tcu::MessageBuilder::operator<<
                                    (&local_498,
                                     (char (*) [77])
                                     "\tNote: Image PresentID 80 was expected to be late by approximately 1 second."
                                    );
                tcu::MessageBuilder::operator<<
                          (pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
                tcu::MessageBuilder::~MessageBuilder(&local_498);
              }
            }
            tcu::TestLog::operator<<(&local_640,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar17 = tcu::MessageBuilder::operator<<
                                (&local_640,(char (*) [26])"\t\t   actualPresentTime = ");
            pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&desired);
            pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [6])" nsec");
            tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_640);
            tcu::TestLog::operator<<(&local_7c0,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar17 = tcu::MessageBuilder::operator<<
                                (&local_7c0,(char (*) [26])"\t\t - desiredPresentTime= ");
            pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&rdur);
            pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [6])" nsec");
            tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_7c0);
            tcu::TestLog::operator<<(&local_940,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar17 = tcu::MessageBuilder::operator<<
                                (&local_940,
                                 (char (*) [45])"\t\t =========================================");
            tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_940);
            tcu::TestLog::operator<<(&local_ac0,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar17 = tcu::MessageBuilder::operator<<
                                (&local_ac0,(char (*) [32])"\t\t   diff              =       ");
            pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&local_198);
            pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [6])" nsec");
            tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_ac0);
            tcu::TestLog::operator<<(&local_c40,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar17 = tcu::MessageBuilder::operator<<
                                (&local_c40,(char (*) [32])"\t\t - refreshDuration   =       ");
            pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&diff1);
            pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [6])" nsec");
            tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_c40);
            tcu::TestLog::operator<<(&local_dc0,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar17 = tcu::MessageBuilder::operator<<
                                (&local_dc0,
                                 (char (*) [45])"\t\t =========================================");
            tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_dc0);
            tcu::TestLog::operator<<
                      ((MessageBuilder *)&actual_1,this_01,
                       (BeginMessageToken *)&tcu::TestLog::Message);
            pMVar17 = tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)&actual_1,
                                 (char (*) [33])"\t\t   diff              =        ");
            pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&diff2);
            pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [6])" nsec");
            tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&actual_1);
            pastPresentationInfoNdx._6_1_ = 1;
          }
          else {
            pvVar15 = std::
                      vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                      ::operator[]((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                                    *)local_f0,local_108);
            uVar18 = pvVar15->actualPresentTime;
            pvVar15 = std::
                      vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                      ::operator[]((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                                    *)local_f0,local_108);
            if ((pvVar15->earliestPresentTime < uVar18) &&
               (pvVar15 = std::
                          vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                          ::operator[]((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                                        *)local_f0,local_108), 2000000 < pvVar15->presentMargin)) {
              pvVar15 = std::
                        vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                        ::operator[]((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                                      *)local_f0,local_108);
              earliest = pvVar15->actualPresentTime;
              pvVar15 = std::
                        vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                        ::operator[]((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                                      *)local_f0,local_108);
              diff = pvVar15->earliestPresentTime;
              local_f58 = earliest - diff;
              tcu::TestLog::operator<<
                        (&local_10d8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar17 = tcu::MessageBuilder::operator<<
                                  (&local_10d8,(char (*) [17])"Image PresentID ");
              pvVar15 = std::
                        vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                        ::operator[]((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                                      *)local_f0,local_108);
              pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&pvVar15->presentID);
              pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [19])" can be presented ")
              ;
              pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&local_f58);
              pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [15])" nsec earlier.");
              tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_10d8);
              tcu::TestLog::operator<<
                        (&local_1258,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar17 = tcu::MessageBuilder::operator<<
                                  (&local_1258,(char (*) [26])"\t\t   actualPresentTime = ");
              pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&earliest);
              pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [6])" nsec");
              tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_1258);
              tcu::TestLog::operator<<
                        (&local_13d8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar17 = tcu::MessageBuilder::operator<<
                                  (&local_13d8,(char (*) [26])"\t\t -earliestPresentTime= ");
              pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&diff);
              pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [6])" nsec");
              tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_13d8);
              tcu::TestLog::operator<<
                        (&local_1558,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar17 = tcu::MessageBuilder::operator<<
                                  (&local_1558,
                                   (char (*) [45])"\t\t =========================================");
              tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_1558);
              tcu::TestLog::operator<<
                        (&local_16d8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar17 = tcu::MessageBuilder::operator<<
                                  (&local_16d8,(char (*) [33])"\t\t   diff              =        ");
              pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&local_f58);
              pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [6])" nsec");
              tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_16d8);
              pastPresentationInfoNdx._7_1_ = 1;
            }
          }
        }
      }
    }
    if ((pastPresentationInfoNdx._6_1_ & 1) == 0) {
      if ((pastPresentationInfoNdx._7_1_ & 1) != 0) {
        dVar19 = this->m_refreshDurationMultiplier - 1;
        this->m_refreshDurationMultiplier = dVar19;
        if (dVar19 == 0) {
          this->m_refreshDurationMultiplier = 1;
        }
        else {
          tcu::TestLog::operator<<
                    ((MessageBuilder *)local_19d8,this_01,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar17 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_19d8,(char (*) [23])"Decreasing multiplier.")
          ;
          tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_19d8);
        }
      }
    }
    else {
      uVar18 = this->m_refreshDurationMultiplier + 1;
      this->m_refreshDurationMultiplier = uVar18;
      if (uVar18 < 3) {
        tcu::TestLog::operator<<(&local_1858,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar17 = tcu::MessageBuilder::operator<<
                            (&local_1858,(char (*) [23])"Increasing multiplier.");
        tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1858);
      }
      else {
        this->m_refreshDurationMultiplier = 2;
      }
    }
    this->m_targetIPD = (this->m_rcDuration).refreshDuration * this->m_refreshDurationMultiplier;
    std::
    vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
    ::~vector((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
               *)local_f0);
  }
  submitInfo.pSignalSemaphores._4_4_ = 0x400;
  local_1a28._0_4_ = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext._0_4_ = 1;
  submitInfo._16_8_ = &currentRenderSemaphore;
  submitInfo.pWaitSemaphores = (VkSemaphore *)((long)&submitInfo.pSignalSemaphores + 4);
  submitInfo.pWaitDstStageMask._0_4_ = 1;
  uVar18 = this->m_frameNdx;
  sVar4 = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::size
                    (&this->m_commandBuffers);
  submitInfo._40_8_ =
       std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::operator[]
                 (&this->m_commandBuffers,uVar18 % sVar4);
  submitInfo.pCommandBuffers._0_4_ = 1;
  submitInfo._56_8_ = local_64 + 4;
  queue = this->m_queue;
  ::vk::Handle<(vk::HandleType)6>::Handle(&stack0xffffffffffffe5d0,0);
  VVar3 = ::vk::DeviceDriver::queueSubmit
                    (&this->m_vkd,queue,1,(VkSubmitInfo *)local_1a28,(VkFence)HStack_1a30.m_internal
                    );
  ::vk::checkResult(VVar3,"m_vkd.queueSubmit(m_queue, 1u, &submitInfo, (vk::VkFence)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                    ,0x4ba);
  if ((this->m_useDisplayTiming & 1U) == 0) {
    local_1b00._0_4_ = VK_STRUCTURE_TYPE_PRESENT_INFO_KHR;
    presentInfo_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    presentInfo_1._4_4_ = 0;
    presentInfo_1.pNext._0_4_ = 1;
    presentInfo_1._16_8_ = local_64 + 4;
    presentInfo_1.pWaitSemaphores._0_4_ = 1;
    presentInfo_1._32_8_ =
         ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)26>_>::operator*
                   (&(this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>);
    presentInfo_1.pSwapchains = (VkSwapchainKHR *)local_64;
    presentInfo_1.pImageIndices = (deUint32 *)((long)&presentInfo_1.pResults + 4);
    VVar3 = ::vk::DeviceDriver::queuePresentKHR
                      (&this->m_vkd,this->m_queue,(VkPresentInfoKHR *)local_1b00);
    ::vk::checkResult(VVar3,"m_vkd.queuePresentKHR(m_queue, &presentInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x50f);
    ::vk::checkResult(presentInfo_1.pResults._4_4_,"result",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x510);
  }
  else {
    dVar22 = this->m_nextPresentID + 1;
    this->m_nextPresentID = dVar22;
    presentTime._0_8_ = this->m_prevDesiredPresentTime;
    dVar19 = deGetMicroseconds();
    mVar20 = dVar19 * 1000;
    pmVar16 = std::
              map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
              ::operator[](&this->m_queuePresentTimes,&this->m_nextPresentID);
    *pmVar16 = mVar20;
    presentTimesInfo.pTimes = (VkPresentTimeGOOGLE *)0x0;
    if (this->m_prevDesiredPresentTime == 0) {
      if (mVar20 == 0) {
        presentTime.presentID = 0;
        presentTime._4_4_ = 0;
      }
      else {
        presentTime._0_8_ = (this->m_targetIPD >> 1) + mVar20;
      }
    }
    else {
      presentTimesInfo.pTimes =
           (VkPresentTimeGOOGLE *)(this->m_prevDesiredPresentTime + this->m_targetIPD);
      if (dVar22 == 0x50) {
        presentTime._0_8_ = presentTime._0_8_ + -1000000000;
        this->m_ExpectImage80Late = true;
      }
    }
    this->m_prevDesiredPresentTime = (deUint64)presentTimesInfo.pTimes;
    presentInfo.pResults._0_4_ = 0x3b9c3160;
    local_1ab8 = (undefined1  [4])0x3b9acde9;
    presentInfo._0_8_ = &presentInfo.pResults;
    presentInfo.pNext._0_4_ = 1;
    presentInfo._16_8_ = local_64 + 4;
    presentInfo.pWaitSemaphores._0_4_ = 1;
    presentInfo._32_8_ =
         ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)26>_>::operator*
                   (&(this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>);
    presentInfo.pSwapchains = (VkSwapchainKHR *)local_64;
    presentInfo.pImageIndices = (deUint32 *)((long)&presentTime.desiredPresentTime + 4);
    VVar3 = ::vk::DeviceDriver::queuePresentKHR
                      (&this->m_vkd,this->m_queue,(VkPresentInfoKHR *)local_1ab8);
    ::vk::checkResult(VVar3,"m_vkd.queuePresentKHR(m_queue, &presentInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x4fd);
    ::vk::checkResult(presentTime.desiredPresentTime._4_4_,"result",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x4fe);
  }
  pvVar21 = std::
            vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
            operator[](&this->m_acquireSemaphores,(ulong)(uint)local_64._0_4_);
  (this->m_freeAcquireSemaphore).m_internal = pvVar21->m_internal;
  pvVar21 = std::
            vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
            operator[](&this->m_acquireSemaphores,(ulong)(uint)local_64._0_4_);
  pvVar21->m_internal = currentRenderSemaphore.m_internal;
  pvVar21 = std::
            vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
            operator[](&this->m_renderSemaphores,(ulong)(uint)local_64._0_4_);
  (this->m_freeRenderSemaphore).m_internal = pvVar21->m_internal;
  pvVar21 = std::
            vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
            operator[](&this->m_renderSemaphores,(ulong)(uint)local_64._0_4_);
  pvVar21->m_internal = stack0xffffffffffffffa0;
  return;
}

Assistant:

void DisplayTimingTestInstance::render (void)
{
	const deUint64		foreverNs		= ~0x0ull;
	const vk::VkFence	fence			= m_fences[m_frameNdx % m_fences.size()];
	const deUint32		width			= m_swapchainConfig.imageExtent.width;
	const deUint32		height			= m_swapchainConfig.imageExtent.height;
	tcu::TestLog&		log				= m_context.getTestContext().getLog();

	// Throttle execution
	if (m_frameNdx >= m_fences.size())
	{
		VK_CHECK(m_vkd.waitForFences(*m_device, 1u, &fence, VK_TRUE, foreverNs));
		VK_CHECK(m_vkd.resetFences(*m_device, 1u, &fence));

		m_vkd.freeCommandBuffers(*m_device, *m_commandPool, 1u, &m_commandBuffers[m_frameNdx % m_commandBuffers.size()]);
		m_commandBuffers[m_frameNdx % m_commandBuffers.size()] = (vk::VkCommandBuffer)0;
	}

	vk::VkSemaphore		currentAcquireSemaphore	= m_freeAcquireSemaphore;
	vk::VkSemaphore		currentRenderSemaphore	= m_freeRenderSemaphore;
	deUint32			imageIndex;

	// Acquire next image
	VK_CHECK(m_vkd.acquireNextImageKHR(*m_device, *m_swapchain, foreverNs, currentAcquireSemaphore, fence, &imageIndex));

	// Create command buffer
	m_commandBuffers[m_frameNdx % m_commandBuffers.size()] = createCommandBuffer(m_vkd, *m_device, *m_commandPool, *m_pipelineLayout, *m_renderPass, m_framebuffers[imageIndex], *m_pipeline, m_frameNdx, m_quadCount, width, height).disown();

	// Obtain timing data from previous frames
	if (m_useDisplayTiming)
	{
		const vector<vk::VkPastPresentationTimingGOOGLE>	pastPresentationTimings	(getPastPresentationTiming(m_vkd, *m_device, *m_swapchain));
		bool												isEarly					= false;
		bool												isLate					= false;

		for (size_t pastPresentationInfoNdx = 0 ; pastPresentationInfoNdx < pastPresentationTimings.size(); pastPresentationInfoNdx++)
		{
			if (m_queuePresentTimes[pastPresentationTimings[pastPresentationInfoNdx].presentID] > pastPresentationTimings[pastPresentationInfoNdx].actualPresentTime)
			{
				m_resultCollector.fail("Image with PresentID " + de::toString(pastPresentationTimings[pastPresentationInfoNdx].presentID) + "was displayed before vkQueuePresentKHR was called.");
			}
			if (!m_ignoreThruPresentID)
			{
				// This is the first time that we've received an
				// actualPresentTime for this swapchain.  In order to not
				// perceive these early frames as "late", we need to sync-up
				// our future desiredPresentTime's with the
				// actualPresentTime(s) that we're receiving now.
				const deInt64	multiple	= m_nextPresentID - pastPresentationTimings.back().presentID;

				m_prevDesiredPresentTime	= pastPresentationTimings.back().actualPresentTime + (multiple * m_targetIPD);
				m_ignoreThruPresentID		= pastPresentationTimings[pastPresentationInfoNdx].presentID + 1;
			}
			else if (pastPresentationTimings[pastPresentationInfoNdx].presentID > m_ignoreThruPresentID)
			{
				if (pastPresentationTimings[pastPresentationInfoNdx].actualPresentTime > (pastPresentationTimings[pastPresentationInfoNdx].desiredPresentTime + m_rcDuration.refreshDuration + MILLISECOND))
				{
					const deUint64 actual	= pastPresentationTimings[pastPresentationInfoNdx].actualPresentTime;
					const deUint64 desired	= pastPresentationTimings[pastPresentationInfoNdx].desiredPresentTime;
					const deUint64 rdur		= m_rcDuration.refreshDuration;
					const deUint64 diff1	= actual - (desired + rdur);
					const deUint64 diff2	= actual - desired;

					log << TestLog::Message << "Image PresentID " << pastPresentationTimings[pastPresentationInfoNdx].presentID << " was " << diff1 << " nsec late." << TestLog::EndMessage;
					if (m_ExpectImage80Late && (pastPresentationTimings[pastPresentationInfoNdx].presentID == 80))
					{
						if (diff1 > (SECOND / 2))
							log << TestLog::Message << "\tNote: Image PresentID 80 was expected to be late by approximately 1 second." << TestLog::EndMessage;
						else
							m_resultCollector.fail("Image PresentID 80 was not late by approximately 1 second, as expected.");
					}
					log << TestLog::Message << "\t\t   actualPresentTime = " << actual << " nsec" << TestLog::EndMessage;
					log << TestLog::Message << "\t\t - desiredPresentTime= " << desired << " nsec" << TestLog::EndMessage;
					log << TestLog::Message << "\t\t =========================================" << TestLog::EndMessage;
					log << TestLog::Message << "\t\t   diff              =       " << diff2 << " nsec" << TestLog::EndMessage;
					log << TestLog::Message << "\t\t - refreshDuration   =       "    << rdur << " nsec" << TestLog::EndMessage;
					log << TestLog::Message << "\t\t =========================================" << TestLog::EndMessage;
					log << TestLog::Message << "\t\t   diff              =        " << diff1 << " nsec" << TestLog::EndMessage;

					isLate = true;
				}
				else if ((pastPresentationTimings[pastPresentationInfoNdx].actualPresentTime > pastPresentationTimings[pastPresentationInfoNdx].earliestPresentTime) &&
						 (pastPresentationTimings[pastPresentationInfoNdx].presentMargin > (2 * MILLISECOND)))
				{
					const deUint64 actual	= pastPresentationTimings[pastPresentationInfoNdx].actualPresentTime;
					const deUint64 earliest	= pastPresentationTimings[pastPresentationInfoNdx].earliestPresentTime;
					const deUint64 diff		= actual - earliest;

					log << TestLog::Message << "Image PresentID " << pastPresentationTimings[pastPresentationInfoNdx].presentID << " can be presented " << diff << " nsec earlier." << TestLog::EndMessage;
					log << TestLog::Message << "\t\t   actualPresentTime = " << actual << " nsec" << TestLog::EndMessage;
					log << TestLog::Message << "\t\t -earliestPresentTime= " << earliest << " nsec" << TestLog::EndMessage;
					log << TestLog::Message << "\t\t =========================================" << TestLog::EndMessage;
					log << TestLog::Message << "\t\t   diff              =        " << diff << " nsec" << TestLog::EndMessage;

					isEarly = true;
				}
			}
		}
		// Preference is given to late presents over early presents:
		if (isLate)
		{
			// Demonstrate how to slow down the frame rate if a frame is late,
			// but don't go too slow (for test time reasons):
			if (++m_refreshDurationMultiplier > 2)
				m_refreshDurationMultiplier = 2;
			else
				log << TestLog::Message << "Increasing multiplier." << TestLog::EndMessage;
		}
		else if (isEarly)
		{
			// Demonstrate how to speed up the frame rate if a frame is early,
			// but don't let the multiplier hit zero:
			if (--m_refreshDurationMultiplier == 0)
				m_refreshDurationMultiplier = 1;
			else
				log << TestLog::Message << "Decreasing multiplier." << TestLog::EndMessage;
		}
		m_targetIPD = m_rcDuration.refreshDuration * m_refreshDurationMultiplier;
	}

	// Submit command buffer
	{
		const vk::VkPipelineStageFlags	dstStageMask	= vk::VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
		const vk::VkSubmitInfo			submitInfo		=
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,
			DE_NULL,
			1u,
			&currentAcquireSemaphore,
			&dstStageMask,
			1u,
			&m_commandBuffers[m_frameNdx % m_commandBuffers.size()],
			1u,
			&currentRenderSemaphore
		};

		VK_CHECK(m_vkd.queueSubmit(m_queue, 1u, &submitInfo, (vk::VkFence)0));
	}

	// Present frame
	if (m_useDisplayTiming)
	{
		// This portion should do interesting bits

		// Initially, mirror reference to move things along
		vk::VkResult result;
		vk::VkPresentTimeGOOGLE presentTime =
		{
			++m_nextPresentID,
			m_prevDesiredPresentTime
		};
		// Record the current time, to record as the time of the vkQueuePresentKHR() call:
		const deUint64 curtimeNano = deGetMicroseconds() * 1000;
		m_queuePresentTimes[m_nextPresentID] = curtimeNano;

		deUint64 desiredPresentTime = 0u;
		if (m_prevDesiredPresentTime == 0)
		{
			// This must be the first present for this swapchain.  Find out the
			// current time, as the basis for desiredPresentTime:
			if (curtimeNano != 0)
			{
				presentTime.desiredPresentTime = curtimeNano;
				presentTime.desiredPresentTime += (m_targetIPD / 2);
			}
			else
			{
				// Since we didn't find out the current time, don't give a
				// desiredPresentTime:
				presentTime.desiredPresentTime = 0;
			}
		}
		else
		{
			desiredPresentTime = m_prevDesiredPresentTime + m_targetIPD;
			if (presentTime.presentID == 80)
			{
				// Test if desiredPresentTime is 1 second earlier (i.e. before the previous image could have been presented)
				presentTime.desiredPresentTime -= SECOND;
				m_ExpectImage80Late = true;
			}
		}
		m_prevDesiredPresentTime = desiredPresentTime;

		const vk::VkPresentTimesInfoGOOGLE presentTimesInfo =
		{
			vk::VK_STRUCTURE_TYPE_PRESENT_TIMES_INFO_GOOGLE,
			DE_NULL,
			1u,
			&presentTime
		};
		const vk::VkPresentInfoKHR presentInfo =
		{
			vk::VK_STRUCTURE_TYPE_PRESENT_INFO_KHR,
			&presentTimesInfo,
			1u,
			&currentRenderSemaphore,
			1u,
			&*m_swapchain,
			&imageIndex,
			&result
		};

		VK_CHECK(m_vkd.queuePresentKHR(m_queue, &presentInfo));
		VK_CHECK(result);
	}
	else
	{
		vk::VkResult result;
		const vk::VkPresentInfoKHR presentInfo =
		{
			vk::VK_STRUCTURE_TYPE_PRESENT_INFO_KHR,
			DE_NULL,
			1u,
			&currentRenderSemaphore,
			1u,
			&*m_swapchain,
			&imageIndex,
			&result
		};

		VK_CHECK(m_vkd.queuePresentKHR(m_queue, &presentInfo));
		VK_CHECK(result);
	}

	{
		m_freeAcquireSemaphore = m_acquireSemaphores[imageIndex];
		m_acquireSemaphores[imageIndex] = currentAcquireSemaphore;

		m_freeRenderSemaphore = m_renderSemaphores[imageIndex];
		m_renderSemaphores[imageIndex] = currentRenderSemaphore;
	}
}